

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomElementPrivate * __thiscall
QDomDocumentPrivate::createElementNS(QDomDocumentPrivate *this,QString *nsURI,QString *qName)

{
  long lVar1;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QDomElementPrivate *e;
  QString fixedName;
  bool ok;
  bool *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QDomElementPrivate *pQVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fixedXmlName((QString *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,SUB81((ulong)in_RDI >> 0x38,0));
  pQVar2 = (QDomElementPrivate *)0x0;
  QString::~QString((QString *)0x11ae59);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QDomElementPrivate* QDomDocumentPrivate::createElementNS(const QString &nsURI, const QString &qName)
{
    bool ok;
    QString fixedName = fixedXmlName(qName, &ok, true);
    if (!ok)
        return nullptr;

    QDomElementPrivate *e = new QDomElementPrivate(this, nullptr, nsURI, fixedName);
    e->ref.deref();
    return e;
}